

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvalidator.c
# Opt level: O2

bool_t ProfileCallback(void *opaque,int type,tchar_t *ClassName,ebml_element *Elt)

{
  undefined8 uVar1;
  uint uVar2;
  tchar_t *ptVar3;
  filepos_t fVar4;
  filepos_t fVar5;
  char *ErrString;
  int ErrCode;
  
  if (type == 2) {
    ptVar3 = *(tchar_t **)((long)opaque + 0x10);
    fVar5 = EBML_ElementPosition(*(ebml_element **)((long)opaque + 8));
    fVar4 = EBML_ElementPosition(Elt);
    ErrString = "Unique element \'%s\' in %s at %ld found more than once at %ld";
    ErrCode = 0x202;
  }
  else {
    if (type == 1) {
      uVar1 = *(undefined8 *)((long)opaque + 0x10);
      fVar5 = EBML_ElementPosition(*(ebml_element **)((long)opaque + 8));
      uVar2 = OutputError(0x200,"Missing element \'%s\' in %s at %ld",ClassName,uVar1,fVar5);
      goto LAB_00109678;
    }
    if (type != 0) {
      return 0;
    }
    ptVar3 = GetProfileName((long)*(int *)((long)opaque + 0x18));
    fVar5 = *(filepos_t *)((long)opaque + 0x10);
    fVar4 = EBML_ElementPosition(*(ebml_element **)((long)opaque + 8));
    ErrString = "Invalid \'%s\' for profile \'%s\' in %s at %ld";
    ErrCode = 0x201;
  }
  uVar2 = OutputError(ErrCode,ErrString,ClassName,ptVar3,fVar5,fVar4);
LAB_00109678:
  **opaque = **opaque | uVar2;
  return 0;
}

Assistant:

static bool_t ProfileCallback(void *opaque, int type, const tchar_t *ClassName, const ebml_element* Elt)
{
    struct profile_check *check = opaque;
    if (type==MASTER_CHECK_PROFILE_INVALID)
        *check->Result |= OutputError(0x201,T("Invalid '%s' for profile '%s' in %s at %") TPRId64,ClassName,GetProfileName(check->ProfileMask),check->EltName,EL_Pos(check->Parent));
    else if (type==MASTER_CHECK_MISSING_MANDATORY)
        *check->Result |= OutputError(0x200,T("Missing element '%s' in %s at %") TPRId64, ClassName,check->EltName,EL_Pos(check->Parent));
    else if (type==MASTER_CHECK_MULTIPLE_UNIQUE)
        *check->Result |= OutputError(0x202,T("Unique element '%s' in %s at %") TPRId64 T(" found more than once at %") TPRId64, ClassName,check->EltName,EL_Pos(check->Parent),EL_Pos(Elt));
    return 0; // don't remove anything
}